

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_meshb_header(char *filename,REF_INT *version,REF_FILEPOS *key_pos)

{
  __off_t _Var1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  int int_version;
  int int_code;
  REF_FILEPOS next_position;
  uint local_4c;
  int local_48;
  int local_44;
  __off_t local_40;
  long local_38;
  
  memset(key_pos,0xff,0x4e0);
  local_4c = 0x9c;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x587,
           "ref_import_meshb_header","unable to open file");
    return 2;
  }
  sVar4 = fread(&local_44,4,1,__stream);
  if (sVar4 == 1) {
    sVar4 = (size_t)local_44;
    if (sVar4 == 1) {
      sVar4 = fread(&local_48,4,1,__stream);
      if (sVar4 == 1) {
        if (local_48 - 5U < 0xfffffffc) {
          printf("version %d not supported\n");
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x58e,"ref_import_meshb_header","version");
          return 1;
        }
        *version = local_48;
        local_40 = ftello(__stream);
        iVar2 = fseeko(__stream,0,2);
        if (iVar2 == 0) {
          local_38 = ftello(__stream);
          while( true ) {
            _Var1 = local_40;
            if ((local_38 < local_40) || (local_40 == 0)) {
              fclose(__stream);
              return 0;
            }
            iVar2 = fseeko(__stream,local_40,0);
            if (iVar2 != 0) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x597,"ref_import_meshb_header","fseeko NEXT failed",0,(long)iVar2);
              return 1;
            }
            sVar4 = fread(&local_4c,4,1,__stream);
            if (sVar4 != 1) break;
            if ((ulong)local_4c < 0x9c) {
              key_pos[local_4c] = _Var1;
            }
            else {
              printf("ignoring keyword %d\n");
            }
            uVar3 = meshb_pos((FILE *)__stream,*version,&local_40);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x5ac,"ref_import_meshb_header",(ulong)uVar3,"pos");
              return uVar3;
            }
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x5a6,"ref_import_meshb_header","keyword code",1,sVar4);
          return 1;
        }
        sVar4 = (size_t)iVar2;
        pcVar6 = "fseeko END failed";
        uVar5 = 0x593;
        uVar7 = 0;
      }
      else {
        pcVar6 = "version";
        uVar7 = 1;
        uVar5 = 0x58b;
      }
    }
    else {
      pcVar6 = "code";
      uVar7 = 1;
      uVar5 = 0x58a;
    }
  }
  else {
    pcVar6 = "code";
    uVar7 = 1;
    uVar5 = 0x589;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar5,
         "ref_import_meshb_header",pcVar6,uVar7,sVar4);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_header(const char *filename,
                                           REF_INT *version,
                                           REF_FILEPOS *key_pos) {
  FILE *file;
  int int_code, int_version;
  REF_INT keyword_code;
  REF_FILEPOS position, next_position, end_position;

  for (keyword_code = 0; keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD;
       keyword_code++)
    key_pos[keyword_code] = REF_EMPTY;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fread((unsigned char *)&int_code, 4, 1, file), "code");
  REIS(1, int_code, "code");
  REIS(1, fread((unsigned char *)&int_version, 4, 1, file), "version");
  if (int_version < 1 || 4 < int_version) {
    printf("version %d not supported\n", int_version);
    THROW("version");
  }
  *version = (REF_INT)int_version;

  next_position = ftello(file);
  REIS(0, fseeko(file, 0, SEEK_END), "fseeko END failed");
  end_position = ftello(file);
  while (next_position <= end_position && 0 != next_position) {
    position = next_position;
    REIS(0, fseeko(file, position, SEEK_SET), "fseeko NEXT failed");
    /*
#include <inttypes.h>
    , {
      printf("end_position = %jd\n", (intmax_t)end_position);
      printf("next_position = %jd\n", (intmax_t)next_position);
      for (keyword_code = 0; keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD;
           keyword_code++) {
        if (REF_EMPTY != key_pos[keyword_code]) {
          printf("key_pos[%d] = %jd\n", keyword_code,
                 (intmax_t)key_pos[keyword_code]);
        }
      }
    });
    */
    REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
    if (0 <= keyword_code && keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD) {
      key_pos[keyword_code] = position;
    } else {
      printf("ignoring keyword %d\n", keyword_code);
    }
    RSS(meshb_pos(file, *version, &next_position), "pos");
  }

  fclose(file);
  return REF_SUCCESS;
}